

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O0

double __thiscall N::histo<double>(N *this,Alg<double> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> output;
  bool bVar1;
  N *in_RDX;
  N r;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffe38;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffe40;
  N *in_stack_fffffffffffffe48;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_fffffffffffffe50;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_fffffffffffffe58;
  N *in_stack_fffffffffffffe60;
  N *in_stack_fffffffffffffe68;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffe88;
  vector<N_*,_std::allocator<N_*>_> *in_stack_fffffffffffffe90;
  anon_class_64_3_558eef7f *in_stack_fffffffffffffea8;
  N *in_stack_fffffffffffffeb0;
  undefined8 local_148;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec8 [24];
  undefined8 local_8;
  
  std::vector<N_*,_std::allocator<N_*>_>::begin(in_stack_fffffffffffffe38);
  std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_fffffffffffffe38);
  std::find<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N*>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(N **)in_stack_fffffffffffffe48);
  std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_fffffffffffffe38);
  bVar1 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                    ((__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                     in_stack_fffffffffffffe40,
                     (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                     in_stack_fffffffffffffe38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<N_*,_std::allocator<N_*>_>::push_back
              (in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
    N(in_RDX,in_stack_fffffffffffffe68);
    all(in_stack_fffffffffffffe60);
    std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function
              ((function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)
               in_stack_fffffffffffffe50._M_current,
               (function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)
               in_stack_fffffffffffffe48);
    std::vector<N_*,_std::allocator<N_*>_>::vector
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    all(in_stack_fffffffffffffe60);
    output._end._M_current = (N **)in_stack_fffffffffffffec8._0_8_;
    output._curr._M_current = (N **)in_stack_fffffffffffffec8._8_8_;
    output.next = (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                   *)in_stack_fffffffffffffec8._16_8_;
    output._start._M_current = in_stack_fffffffffffffec0._M_current;
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    map<N::histo<double>(std::function<double(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,output);
    histo<double>(std::function<double(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)
    ::{lambda(N*)#1}::~function((anon_class_64_3_558eef7f *)in_stack_fffffffffffffeb0);
    std::vector<N_*,_std::allocator<N_*>_>::pop_back((vector<N_*,_std::allocator<N_*>_> *)0x17e536);
    local_8 = std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
                        ((function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)
                         in_stack_fffffffffffffec0._M_current,local_148,
                         (vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffeb0);
    ~N(in_stack_fffffffffffffeb0);
  }
  else {
    local_8 = std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
                        ((function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)
                         in_stack_fffffffffffffe50._M_current,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
  }
  return local_8;
}

Assistant:

B histo(const alg::Alg<B>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        auto r(*this);
        this->all().map([&, alg, line](N* n){return new (g) N(n->histo(alg, line));}, r.all());

        line.pop_back();
        return alg(r, line);
    }